

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

char * borg_race_name(wchar_t r_idx)

{
  char *pcStack_10;
  wchar_t r_idx_local;
  
  if (r_idx == L'\0') {
    pcStack_10 = "dead monster";
  }
  else if (r_idx < (uint)z_info->r_max + L'\xffffffff') {
    pcStack_10 = r_info[r_idx].name;
  }
  else {
    pcStack_10 = "player ghost";
  }
  return pcStack_10;
}

Assistant:

const char *borg_race_name(int r_idx)
{
    /* Paranoia */
    if (!r_idx)
        return "dead monster";

    /* "player ghosts" */
    if (r_idx >= z_info->r_max - 1)
        return "player ghost";

    return r_info[r_idx].name;
}